

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

action Search::search_predict
                 (search_private *priv,example *ecs,size_t ec_cnt,ptag mytag,action *oracle_actions,
                 size_t oracle_actions_cnt,ptag *condition_on,char *condition_on_names,
                 action *allowed_actions,size_t allowed_actions_cnt,float *allowed_actions_cost,
                 size_t learner_id,float *a_cost,float param_14)

{
  v_array<char> *this;
  SearchState SVar1;
  scored_action *psVar2;
  uint *__dest;
  action_repr *paVar3;
  v_array<Search::action_cache> *pvVar4;
  BaseTask *pBVar5;
  uchar *puVar6;
  ptag mytag_00;
  bool bVar7;
  action aVar8;
  int iVar9;
  undefined4 extraout_var_00;
  example *peVar10;
  ulong uVar11;
  size_t sVar12;
  undefined3 extraout_var;
  vw_exception *this_00;
  ostream *poVar13;
  undefined8 *puVar14;
  uint uVar15;
  features *pfVar16;
  features *pfVar17;
  _func_void_void_ptr_void_ptr *copy_label;
  ulong t;
  size_t sVar18;
  v_array<Search::action_repr> *v;
  char *pcVar19;
  size_t sVar20;
  search_private *this_01;
  byte bVar21;
  action *pos;
  long lVar22;
  action_repr item;
  action a;
  byte local_255;
  undefined4 local_254;
  size_t local_250;
  uint local_244;
  example *local_240;
  size_t local_238;
  features *local_230;
  v_array<example> *local_228;
  ulong local_220;
  ptag local_218;
  uint local_214;
  ulong local_210;
  ulong local_208;
  features *local_200;
  string local_1f8;
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  stringstream __msg;
  float fStack_1b4;
  ostream local_1a8;
  
  local_240 = ecs;
  if (condition_on_names == (char *)0x0) {
    local_230 = (features *)0x0;
  }
  else {
    local_230 = (features *)strlen(condition_on_names);
  }
  sVar18 = priv->t;
  t = priv->meta_t + sVar18;
  priv->t = sVar18 + 1;
  SVar1 = priv->state;
  if ((SVar1 == GET_TRUTH_STRING) || (priv->force_oracle == true)) {
    aVar8 = choose_oracle_action
                      (priv,ec_cnt,oracle_actions,oracle_actions_cnt,allowed_actions,
                       allowed_actions_cnt,allowed_actions_cost);
    *a_cost = 0.0;
  }
  else {
    uVar11 = priv->learn_t;
    if (t < uVar11 && SVar1 == LEARN) {
      psVar2 = (priv->train_trajectory)._begin;
      aVar8 = psVar2[t].a;
      *a_cost = psVar2[t].s;
      if ((priv->metaoverride != (BaseTask *)0x0) &&
         (priv->metaoverride->_foreach_action !=
          (_func_void_search_ptr_size_t_float_action_bool_float *)0x0)) {
        foreach_action_from_cache(priv,t,0xffffffff);
      }
    }
    else {
      bVar7 = priv->is_ldf;
      sVar20 = ec_cnt;
      if ((bVar7 == false) && (sVar20 = allowed_actions_cnt, allowed_actions_cnt == 0)) {
        sVar20 = priv->A;
      }
      local_238 = oracle_actions_cnt;
      local_228 = (v_array<example> *)oracle_actions;
      if (t != uVar11 || SVar1 != LEARN) {
        sVar20 = CONCAT71((int7)(oracle_actions_cnt >> 8),uVar11 < t && SVar1 == LEARN);
        if ((uVar11 < t && SVar1 == LEARN) &&
           (priv->rollout_num_steps - 1 < priv->loss_declared_cnt)) {
          aVar8 = 0;
          if ((bVar7 == false) &&
             (aVar8 = 1, allowed_actions_cnt != 0 && allowed_actions != (action *)0x0)) {
            aVar8 = *allowed_actions;
          }
          pBVar5 = priv->metaoverride;
          if ((pBVar5 != (BaseTask *)0x0) &&
             (pBVar5->_post_prediction != (_func_void_search_ptr_size_t_action_float *)0x0)) {
            (*pBVar5->_post_prediction)(pBVar5->sch,sVar18,aVar8,0.0);
          }
          if ((priv->metaoverride != (BaseTask *)0x0) &&
             (priv->metaoverride->_foreach_action !=
              (_func_void_search_ptr_size_t_float_action_bool_float *)0x0)) {
            foreach_action_from_cache(priv,t,0xffffffff);
          }
          *a_cost = 0.0;
          return aVar8;
        }
        if ((1 < SVar1 - INIT_TEST) && ((SVar1 != LEARN || (t <= uVar11)))) {
          std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&local_1a8,"error: predict called in unknown state",0x26);
          this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (this_00,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search.cc"
                     ,0x749,&local_1f8);
          __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        iVar9 = choose_policy(priv,true);
        local_250 = CONCAT44(extraout_var_00,iVar9);
        a = 0;
        local_244 = 0;
        if (((priv->state == INIT_TRAIN) && (priv->rollout_method == NO_ROLLOUT)) &&
           (local_244 = 1, local_238 == 0)) {
          local_244 = (uint)priv->use_action_costs;
        }
        *a_cost = 0.0;
        pBVar5 = priv->metaoverride;
        if (pBVar5 == (BaseTask *)0x0) {
          local_254 = 0;
        }
        else {
          local_254 = 0;
          if ((pBVar5->_maybe_override_prediction !=
               (_func_bool_search_ptr_size_t_action_ptr_float_ptr *)0x0) && (priv->state != LEARN))
          {
            bVar7 = (*pBVar5->_maybe_override_prediction)(pBVar5->sch,t - priv->meta_t,&a,a_cost);
            local_254 = CONCAT31(extraout_var,bVar7);
            if (((bVar7) &&
                ((priv->state == INIT_TRAIN && (priv->metatask != (search_metatask *)0x0)))) &&
               (priv->metaoverride != (BaseTask *)0x0)) {
              ___msg = 0;
              fStack_1b4 = 0.0;
              v_array<v_array<Search::action_cache>_*>::push_back
                        (&priv->memo_foreach_action,(v_array<Search::action_cache> **)&__msg);
            }
          }
        }
        bVar21 = (byte)local_244;
        sVar18 = local_238;
        if (((int)local_250 == -1) && ((char)local_254 == '\0')) {
          sVar20 = allowed_actions_cnt;
          a = choose_oracle_action
                        (priv,ec_cnt,(action *)local_228,local_238,allowed_actions,
                         allowed_actions_cnt,allowed_actions_cost);
          bVar21 = (byte)local_244;
        }
        pfVar16 = local_230;
        if (((int)local_250 == -1) && (priv->metaoverride != (BaseTask *)0x0)) {
          uVar15 = (uint)CONCAT71((int7)(sVar18 >> 8),
                                  priv->metaoverride->_foreach_action !=
                                  (_func_void_search_ptr_size_t_float_action_bool_float *)0x0);
        }
        else {
          uVar15 = 0;
        }
        if ((-1 < (int)local_250 || (bVar21 & 1) != 0) || ((char)uVar15 != '\0')) {
          local_208 = local_250 & 0xffffffff;
          if (-1 < (int)local_250) {
            iVar9 = (int)learner_id;
            if ((priv->xv == true) && (iVar9 = iVar9 * 3, priv->state == INIT_TEST)) {
              iVar9 = iVar9 + ((uint)priv->all->sd->example_number & 1) + 1;
            }
            local_208 = (ulong)(uint)(iVar9 + (int)priv->num_learners * (int)local_250);
          }
          local_220 = t;
          local_214 = uVar15;
          ensure_size<Search::action_repr>(&priv->condition_on_actions,(size_t)local_230);
          t = local_220;
          peVar10 = local_240;
          if (pfVar16 != (features *)0x0) {
            lVar22 = 0;
            pfVar16 = local_230;
            do {
              uVar11 = (ulong)*(uint *)((long)condition_on + lVar22);
              if ((uVar11 == 0) ||
                 (paVar3 = (priv->ptag_to_action)._begin,
                 (ulong)((long)(priv->ptag_to_action)._end - (long)paVar3 >> 4) <= uVar11)) {
                pfVar17 = (features *)0x0;
                aVar8 = 0;
              }
              else {
                aVar8 = paVar3[uVar11].a;
                sVar20 = (size_t)*(uint *)&paVar3[uVar11].field_0x4;
                pfVar17 = paVar3[uVar11].repr;
              }
              paVar3 = (priv->condition_on_actions)._begin;
              (&paVar3->a)[lVar22] = aVar8;
              *(int *)(&paVar3->field_0x4 + lVar22 * 4) = (int)sVar20;
              *(features **)((long)&paVar3->repr + lVar22 * 4) = pfVar17;
              lVar22 = lVar22 + 4;
              pfVar16 = (features *)&pfVar16[-1].field_0x67;
            } while (pfVar16 != (features *)0x0);
          }
          local_255 = 1;
          if (priv->all->training != false) {
            local_255 = local_240->test_only;
          }
          if (((((byte)local_254 | (byte)local_214 | local_255) & 1) == 0) &&
             (bVar7 = cached_action_store_or_find
                                (priv,mytag,condition_on,condition_on_names,
                                 (priv->condition_on_actions)._begin,(size_t)local_230,
                                 (int)local_250,learner_id,&a,false,a_cost), bVar7)) {
            priv->total_cache_hits = priv->total_cache_hits + 1;
          }
          else {
            local_218 = mytag;
            if (priv->is_ldf == true) {
              bVar7 = COST_SENSITIVE::ec_is_example_header(peVar10);
              local_210 = (ulong)bVar7;
            }
            else {
              local_210 = 0;
            }
            this_01 = (search_private *)&priv->last_action_repr;
            local_200 = (features *)this_01;
            features::clear((features *)this_01);
            pfVar16 = local_230;
            lVar22 = ec_cnt - local_210;
            if ((local_210 <= ec_cnt && lVar22 != 0) && (priv->auto_condition_features != false)) {
              peVar10 = local_240 + local_210;
              do {
                this_01 = priv;
                add_example_conditioning
                          (priv,peVar10,(size_t)pfVar16,condition_on_names,
                           (priv->condition_on_actions)._begin);
                peVar10 = peVar10 + 1;
                lVar22 = lVar22 + -1;
              } while (lVar22 != 0);
            }
            t = local_220;
            peVar10 = local_240;
            if ((~(byte)local_254 & -1 < (int)local_250) != 0 || (local_214 & 1) != 0) {
              if ((priv->auto_condition_features == true) &&
                 ((priv->acset).use_passthrough_repr == true)) {
                if (priv->is_ldf == true) {
                  pcVar19 = "search cannot use state representations in ldf mode";
LAB_001217c4:
                  poVar13 = std::operator<<((ostream *)&std::cerr,pcVar19);
                  std::endl<char,std::char_traits<char>>(poVar13);
                  puVar14 = (undefined8 *)__cxa_allocate_exception(8);
                  *puVar14 = exit;
                  __cxa_throw(puVar14,&std::exception::typeinfo,std::exception::~exception);
                }
                if (local_240->passthrough != (features *)0x0) {
                  pcVar19 = "search cannot passthrough";
                  goto LAB_001217c4;
                }
                local_240->passthrough = local_200;
              }
              aVar8 = 0xffffffff;
              if ((char)local_214 != '\0') {
                aVar8 = a;
              }
              if (priv->is_ldf == true) {
                this_01 = priv;
                a = single_prediction_LDF(priv,local_240,ec_cnt,(int)local_208,a_cost,aVar8);
              }
              else {
                this_01 = priv;
                a = single_prediction_notLDF
                              (priv,local_240,(int)local_208,allowed_actions,allowed_actions_cnt,
                               allowed_actions_cost,a_cost,aVar8);
              }
              peVar10->passthrough = (features *)0x0;
            }
            if ((char)local_244 != '\0') {
              allowed_actions_to_label
                        (priv,ec_cnt,allowed_actions,allowed_actions_cnt,allowed_actions_cost,
                         (action *)local_228,local_238,&priv->gte_label);
              priv->learn_ec_ref = local_240;
              priv->learn_ec_ref_cnt = ec_cnt;
              if (allowed_actions != (action *)0x0) {
                ensure_size<unsigned_int>(&priv->learn_allowed_actions,allowed_actions_cnt);
                memcpy((priv->learn_allowed_actions)._begin,allowed_actions,allowed_actions_cnt << 2
                      );
              }
              sVar18 = priv->learn_learner_id;
              priv->learn_learner_id = learner_id;
              this_01 = priv;
              generate_training_example(priv,&priv->gte_label,1.0,false,3.4028235e+38);
              priv->learn_learner_id = sVar18;
              t = local_220;
            }
            mytag_00 = local_218;
            lVar22 = ec_cnt - local_210;
            if ((local_210 <= ec_cnt && lVar22 != 0) && (priv->auto_condition_features != false)) {
              peVar10 = local_240 + local_210;
              do {
                puVar6 = (peVar10->super_example_predict).indices._end;
                if ((puVar6 != (peVar10->super_example_predict).indices._begin) &&
                   (puVar6[-1] == 0x86)) {
                  del_features_in_top_namespace(this_01,peVar10,0x86);
                }
                peVar10 = peVar10 + 1;
                lVar22 = lVar22 + -1;
              } while (lVar22 != 0);
            }
            if ((char)local_254 == '\0' && local_255 == 0) {
              cached_action_store_or_find
                        (priv,mytag_00,condition_on,condition_on_names,
                         (priv->condition_on_actions)._begin,(size_t)local_230,(int)local_250,
                         learner_id,&a,true,a_cost);
            }
          }
        }
        if (priv->state == INIT_TRAIN) {
          fStack_1b4 = *a_cost;
          ___msg = a;
          v_array<Search::scored_action>::push_back(&priv->train_trajectory,(scored_action *)&__msg)
          ;
        }
        pBVar5 = priv->metaoverride;
        if (pBVar5 == (BaseTask *)0x0) {
          return a;
        }
        if (pBVar5->_post_prediction == (_func_void_search_ptr_size_t_action_float *)0x0) {
          return a;
        }
        (*pBVar5->_post_prediction)(pBVar5->sch,t - priv->meta_t,a,*a_cost);
        return a;
      }
      local_250 = priv->learn_a_idx;
      priv->loss_declared_cnt = 0;
      priv->learn_a_idx = local_250 + 1;
      if (sVar20 <= local_250 + 1) {
        priv->done_with_all_actions = true;
        priv->learn_learner_id = learner_id;
        if (oracle_actions_cnt != 0) {
          priv->learn_oracle_action = *oracle_actions;
        }
        priv->learn_ec_ref_cnt = ec_cnt;
        peVar10 = local_240;
        if (priv->examples_dont_change == false) {
          sVar18 = 8;
          copy_label = (_func_void_void_ptr_void_ptr *)0x0;
          if (bVar7 != false) {
            sVar18 = 0x20;
            copy_label = (_func_void_void_ptr_void_ptr *)PTR_copy_label_002d0d38;
          }
          local_228 = &priv->learn_ec_copy;
          local_220 = t;
          ensure_size<example>(local_228,ec_cnt);
          peVar10 = local_240;
          if (ec_cnt != 0) {
            lVar22 = 0;
            do {
              VW::copy_example_data
                        (priv->all->audit,
                         (example *)
                         ((long)(((priv->learn_ec_copy)._begin)->super_example_predict).
                                feature_space + lVar22 + -0x20),
                         (example *)
                         ((long)(peVar10->super_example_predict).feature_space + lVar22 + -0x20),
                         sVar18,copy_label);
              lVar22 = lVar22 + 0x68d0;
              ec_cnt = ec_cnt - 1;
            } while (ec_cnt != 0);
          }
          peVar10 = local_228->_begin;
          t = local_220;
        }
        pfVar16 = local_230;
        priv->learn_ec_ref = peVar10;
        if (priv->auto_condition_features == true) {
          pos = allowed_actions;
          ensure_size<unsigned_int>(&priv->learn_condition_on,(size_t)local_230);
          ensure_size<Search::action_repr>(&priv->learn_condition_on_act,(size_t)pfVar16);
          __dest = (priv->learn_condition_on)._begin;
          (priv->learn_condition_on)._end = __dest + (long)pfVar16;
          memcpy(__dest,condition_on,(long)pfVar16 * 4);
          if (pfVar16 != (features *)0x0) {
            pfVar16 = (features *)0x0;
            do {
              uVar11 = (ulong)condition_on[(long)pfVar16];
              if ((uVar11 == 0) ||
                 (paVar3 = (priv->ptag_to_action)._begin,
                 (ulong)((long)(priv->ptag_to_action)._end - (long)paVar3 >> 4) <= uVar11)) {
                v = (v_array<Search::action_repr> *)0x0;
                pfVar17 = (features *)0x0;
              }
              else {
                v = (v_array<Search::action_repr> *)(ulong)paVar3[uVar11].a;
                pfVar17 = paVar3[uVar11].repr;
              }
              item.repr = pfVar16;
              item._0_8_ = pfVar17;
              push_at<Search::action_repr>
                        ((Search *)&priv->learn_condition_on_act,v,item,(size_t)pos);
              pfVar16 = (features *)((long)&(pfVar16->values)._begin + 1);
            } while (local_230 != pfVar16);
          }
          this = &priv->learn_condition_on_names;
          if (condition_on_names == (char *)0x0) {
            if ((priv->learn_condition_on_names).end_array ==
                (priv->learn_condition_on_names)._begin) {
              v_array<char>::resize(this,3);
            }
            pcVar19 = (priv->learn_condition_on_names)._begin;
            (priv->learn_condition_on_names)._end = pcVar19 + 1;
            *pcVar19 = '\0';
          }
          else {
            sVar12 = strlen(condition_on_names);
            ensure_size<char>(this,sVar12 + 1);
            strcpy(this->_begin,condition_on_names);
          }
        }
        if (allowed_actions_cnt != 0 && allowed_actions != (action *)0x0) {
          ensure_size<unsigned_int>(&priv->learn_allowed_actions,allowed_actions_cnt);
          memcpy((priv->learn_allowed_actions)._begin,allowed_actions,allowed_actions_cnt * 4);
          local_1d8[0] = local_1c8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1d8,"in LEARN, learn_allowed_actions","");
          if (local_1d8[0] != local_1c8) {
            operator_delete(local_1d8[0]);
          }
        }
      }
      sVar18 = local_250;
      *a_cost = 0.0;
      if (allowed_actions_cnt == 0 || allowed_actions == (action *)0x0) {
        aVar8 = (priv->is_ldf ^ 1) + (int)local_250;
      }
      else {
        aVar8 = allowed_actions[local_250 & 0xffffffff];
      }
      if ((priv->metaoverride != (BaseTask *)0x0) &&
         (priv->metaoverride->_foreach_action !=
          (_func_void_search_ptr_size_t_float_action_bool_float *)0x0)) {
        foreach_action_from_cache(priv,t,aVar8);
        pvVar4 = (priv->memo_foreach_action)._begin[t];
        if (pvVar4 != (v_array<Search::action_cache> *)0x0) {
          *a_cost = pvVar4->_begin[sVar18 & 0xffffffff].cost;
        }
      }
    }
    pBVar5 = priv->metaoverride;
    if ((pBVar5 != (BaseTask *)0x0) &&
       (pBVar5->_post_prediction != (_func_void_search_ptr_size_t_action_float *)0x0)) {
      (*pBVar5->_post_prediction)(pBVar5->sch,t - priv->meta_t,aVar8,*a_cost);
    }
  }
  return aVar8;
}

Assistant:

action search_predict(search_private& priv, example* ecs, size_t ec_cnt, ptag mytag, const action* oracle_actions,
    size_t oracle_actions_cnt, const ptag* condition_on, const char* condition_on_names, const action* allowed_actions,
    size_t allowed_actions_cnt, const float* allowed_actions_cost, size_t learner_id, float& a_cost, float /* weight */)
{
  size_t condition_on_cnt = condition_on_names ? strlen(condition_on_names) : 0;
  size_t t = priv.t + priv.meta_t;
  priv.t++;

  // make sure parameters come in pairs correctly
  assert((oracle_actions == nullptr) == (oracle_actions_cnt == 0));
  assert((condition_on == nullptr) == (condition_on_names == nullptr));
  assert(((allowed_actions == nullptr) && (allowed_actions_cost == nullptr)) == (allowed_actions_cnt == 0));
  assert(priv.use_action_costs == (allowed_actions_cost != nullptr));
  if (allowed_actions_cost != nullptr)
    assert(oracle_actions == nullptr);

  // if we're just after the string, choose an oracle action
  if ((priv.state == GET_TRUTH_STRING) || priv.force_oracle)
  {
    action a = choose_oracle_action(
        priv, ec_cnt, oracle_actions, oracle_actions_cnt, allowed_actions, allowed_actions_cnt, allowed_actions_cost);
    // if (priv.metaoverride && priv.metaoverride->_post_prediction)
    //  priv.metaoverride->_post_prediction(*priv.metaoverride->sch, t-priv.meta_t, a, 0.);
    a_cost = 0.;
    return a;
  }

  // if we're in LEARN mode and before learn_t, return the train action
  if ((priv.state == LEARN) && (t < priv.learn_t))
  {
    assert(t < priv.train_trajectory.size());
    action a = priv.train_trajectory[t].a;
    a_cost = priv.train_trajectory[t].s;
    cdbg << "LEARN " << t << " < priv.learn_t ==> a=" << a << ", a_cost=" << a_cost << endl;
    if (priv.metaoverride && priv.metaoverride->_foreach_action)
      foreach_action_from_cache(priv, t);
    if (priv.metaoverride && priv.metaoverride->_post_prediction)
      priv.metaoverride->_post_prediction(*priv.metaoverride->sch, t - priv.meta_t, a, a_cost);
    return a;
  }

  // for LDF, # of valid actions is ec_cnt; otherwise it's either allowed_actions_cnt or A
  size_t valid_action_cnt = priv.is_ldf ? ec_cnt : (allowed_actions_cnt > 0) ? allowed_actions_cnt : priv.A;

  // if we're in LEARN mode and _at_ learn_t, then:
  //   - choose the next action
  //   - decide if we're done
  //   - if we are, then copy/mark the example ref
  if ((priv.state == LEARN) && (t == priv.learn_t))
  {
    action a = (action)priv.learn_a_idx;
    priv.loss_declared_cnt = 0;

    cdbg << "LEARN " << t << " = priv.learn_t ==> a=" << a << ", learn_a_idx=" << priv.learn_a_idx
         << " valid_action_cnt=" << valid_action_cnt << endl;
    priv.learn_a_idx++;

    // check to see if we're done with available actions
    if (priv.learn_a_idx >= valid_action_cnt)
    {
      priv.done_with_all_actions = true;
      priv.learn_learner_id = learner_id;

      // set reference or copy example(s)
      if (oracle_actions_cnt > 0)
        priv.learn_oracle_action = oracle_actions[0];
      priv.learn_ec_ref_cnt = ec_cnt;
      if (priv.examples_dont_change)
        priv.learn_ec_ref = ecs;
      else
      {
        size_t label_size = priv.is_ldf ? sizeof(CS::label) : sizeof(MC::label_t);
        void (*label_copy_fn)(void*, void*) = priv.is_ldf ? CS::cs_label.copy_label : nullptr;

        ensure_size(priv.learn_ec_copy, ec_cnt);
        for (size_t i = 0; i < ec_cnt; i++)
          VW::copy_example_data(priv.all->audit, priv.learn_ec_copy.begin() + i, ecs + i, label_size, label_copy_fn);

        priv.learn_ec_ref = priv.learn_ec_copy.begin();
      }

      // copy conditioning stuff and allowed actions
      if (priv.auto_condition_features)
      {
        ensure_size(priv.learn_condition_on, condition_on_cnt);
        ensure_size(priv.learn_condition_on_act, condition_on_cnt);

        priv.learn_condition_on.end() =
            priv.learn_condition_on.begin() + condition_on_cnt;  // allow .size() to be used in lieu of _cnt

        memcpy(priv.learn_condition_on.begin(), condition_on, condition_on_cnt * sizeof(ptag));

        for (size_t i = 0; i < condition_on_cnt; i++)
          push_at(priv.learn_condition_on_act,
              action_repr(((1 <= condition_on[i]) && (condition_on[i] < priv.ptag_to_action.size()))
                      ? priv.ptag_to_action[condition_on[i]]
                      : 0),
              i);

        if (condition_on_names == nullptr)
        {
          ensure_size(priv.learn_condition_on_names, 1);
          priv.learn_condition_on_names[0] = 0;
        }
        else
        {
          ensure_size(priv.learn_condition_on_names, strlen(condition_on_names) + 1);
          strcpy(priv.learn_condition_on_names.begin(), condition_on_names);
        }
      }

      if (allowed_actions && (allowed_actions_cnt > 0))
      {
        ensure_size(priv.learn_allowed_actions, allowed_actions_cnt);
        memcpy(priv.learn_allowed_actions.begin(), allowed_actions, allowed_actions_cnt * sizeof(action));
        cdbg_print_array("in LEARN, learn_allowed_actions", priv.learn_allowed_actions);
      }
    }

    assert((allowed_actions_cnt == 0) || (a < allowed_actions_cnt));

    a_cost = 0.;
    action a_name = (allowed_actions && (allowed_actions_cnt > 0)) ? allowed_actions[a] : priv.is_ldf ? a : (a + 1);
    if (priv.metaoverride && priv.metaoverride->_foreach_action)
    {
      foreach_action_from_cache(priv, t, a_name);
      if (priv.memo_foreach_action[t])
      {
        cdbg << "@ memo_foreach_action: t=" << t << ", a=" << a << ", cost=" << (*priv.memo_foreach_action[t])[a].cost
             << endl;
        a_cost = (*priv.memo_foreach_action[t])[a].cost;
      }
    }

    a = a_name;

    if (priv.metaoverride && priv.metaoverride->_post_prediction)
      priv.metaoverride->_post_prediction(*priv.metaoverride->sch, t - priv.meta_t, a, a_cost);
    return a;
  }

  if ((priv.state == LEARN) && (t > priv.learn_t) && (priv.rollout_num_steps > 0) &&
      (priv.loss_declared_cnt >= priv.rollout_num_steps))
  {
    cdbg << "... skipping" << endl;
    action a = priv.is_ldf ? 0 : ((allowed_actions && (allowed_actions_cnt > 0)) ? allowed_actions[0] : 1);
    if (priv.metaoverride && priv.metaoverride->_post_prediction)
      priv.metaoverride->_post_prediction(*priv.metaoverride->sch, t - priv.meta_t, a, 0.);
    if (priv.metaoverride && priv.metaoverride->_foreach_action)
      foreach_action_from_cache(priv, t);
    a_cost = 0.;
    return a;
  }

  if ((priv.state == INIT_TRAIN) || (priv.state == INIT_TEST) || ((priv.state == LEARN) && (t > priv.learn_t)))
  {
    // we actually need to run the policy

    int policy = choose_policy(priv);
    action a = 0;

    cdbg << "executing policy " << policy << endl;

    bool gte_here = (priv.state == INIT_TRAIN) && (priv.rollout_method == NO_ROLLOUT) &&
        ((oracle_actions_cnt > 0) || (priv.use_action_costs));
    a_cost = 0.;
    bool skip = false;

    if (priv.metaoverride && priv.metaoverride->_maybe_override_prediction &&
        (priv.state != LEARN))  // if LEARN and t>learn_t,then we cannot allow overrides!
    {
      skip = priv.metaoverride->_maybe_override_prediction(*priv.metaoverride->sch, t - priv.meta_t, a, a_cost);
      cdbg << "maybe_override_prediction --> " << skip << ", a=" << a << ", a_cost=" << a_cost << endl;
      if (skip && need_memo_foreach_action(priv))
        priv.memo_foreach_action.push_back(nullptr);
    }

    if ((!skip) && (policy == -1))
      a = choose_oracle_action(priv, ec_cnt, oracle_actions, oracle_actions_cnt, allowed_actions, allowed_actions_cnt,
          allowed_actions_cost);  // TODO: we probably want to actually get costs for oracle actions???

    bool need_fea = (policy == -1) && priv.metaoverride && priv.metaoverride->_foreach_action;

    if ((policy >= 0) || gte_here || need_fea)  // the last case is we need to do foreach action
    {
      int learner = select_learner(priv, policy, learner_id, false, priv.state != INIT_TEST);

      ensure_size(priv.condition_on_actions, condition_on_cnt);
      for (size_t i = 0; i < condition_on_cnt; i++)
        priv.condition_on_actions[i] = ((1 <= condition_on[i]) && (condition_on[i] < priv.ptag_to_action.size()))
            ? priv.ptag_to_action[condition_on[i]]
            : 0;

      bool not_test = priv.all->training && !ecs[0].test_only;

      if ((!skip) && (!need_fea) && not_test &&
          cached_action_store_or_find(priv, mytag, condition_on, condition_on_names, priv.condition_on_actions.begin(),
              condition_on_cnt, policy, learner_id, a, false, a_cost))
        // if this succeeded, 'a' has the right action
        priv.total_cache_hits++;
      else  // we need to predict, and then cache, and maybe run foreach_action
      {
        size_t start_K = (priv.is_ldf && COST_SENSITIVE::ec_is_example_header(ecs[0])) ? 1 : 0;
        priv.last_action_repr.clear();
        if (priv.auto_condition_features)
          for (size_t n = start_K; n < ec_cnt; n++)
            add_example_conditioning(
                priv, ecs[n], condition_on_cnt, condition_on_names, priv.condition_on_actions.begin());

        if (((!skip) && (policy >= 0)) || need_fea)  // only make a prediction if we're going to use the output
        {
          if (priv.auto_condition_features && priv.acset.use_passthrough_repr)
          {
            if (priv.is_ldf)
            {
              std::cerr << "search cannot use state representations in ldf mode" << endl;
              throw exception();
            }
            if (ecs[0].passthrough)
            {
              std::cerr << "search cannot passthrough" << endl;
              throw exception();
            }
            ecs[0].passthrough = &priv.last_action_repr;
          }
          a = priv.is_ldf ? single_prediction_LDF(priv, ecs, ec_cnt, learner, a_cost, need_fea ? a : (action)-1)
                          : single_prediction_notLDF(priv, *ecs, learner, allowed_actions, allowed_actions_cnt,
                                allowed_actions_cost, a_cost, need_fea ? a : (action)-1);

          cdbg << "passthrough = [";
          for (size_t kk = 0; kk < priv.last_action_repr.size(); kk++)
            cdbg << ' ' << priv.last_action_repr.indicies[kk] << ':' << priv.last_action_repr.values[kk];
          cdbg << " ]" << endl;

          ecs[0].passthrough = nullptr;
        }

        if (need_fea)
        {
          // TODO this
        }

        if (gte_here)
        {
          cdbg << "INIT_TRAIN, NO_ROLLOUT, at least one oracle_actions, a=" << a << endl;
          // we can generate a training example _NOW_ because we're not doing rollouts
          // allowed_actions_to_losses(priv, ec_cnt, allowed_actions, allowed_actions_cnt, oracle_actions,
          // oracle_actions_cnt, losses);
          allowed_actions_to_label(priv, ec_cnt, allowed_actions, allowed_actions_cnt, allowed_actions_cost,
              oracle_actions, oracle_actions_cnt, priv.gte_label);
          cdbg << "priv.gte_label = [";
          for (size_t i = 0; i < priv.gte_label.cs.costs.size(); i++)
            cdbg << ' ' << priv.gte_label.cs.costs[i].class_index << ':' << priv.gte_label.cs.costs[i].x;
          cdbg << " ]" << endl;

          priv.learn_ec_ref = ecs;
          priv.learn_ec_ref_cnt = ec_cnt;
          if (allowed_actions)
          {
            ensure_size(priv.learn_allowed_actions, allowed_actions_cnt);  // TODO: do we really need this?
            memcpy(priv.learn_allowed_actions.begin(), allowed_actions, allowed_actions_cnt * sizeof(action));
          }
          size_t old_learner_id = priv.learn_learner_id;
          priv.learn_learner_id = learner_id;
          generate_training_example(
              priv, priv.gte_label, 1., false);  // this is false because the conditioning has already been added!
          priv.learn_learner_id = old_learner_id;
        }

        if (priv.auto_condition_features)
          for (size_t n = start_K; n < ec_cnt; n++) del_example_conditioning(priv, ecs[n]);

        if (not_test && (!skip))
          cached_action_store_or_find(priv, mytag, condition_on, condition_on_names, priv.condition_on_actions.begin(),
              condition_on_cnt, policy, learner_id, a, true, a_cost);
      }
    }

    if (priv.state == INIT_TRAIN)
      priv.train_trajectory.push_back(scored_action(a, a_cost));  // note the action for future reference

    if (priv.metaoverride && priv.metaoverride->_post_prediction)
      priv.metaoverride->_post_prediction(*priv.metaoverride->sch, t - priv.meta_t, a, a_cost);

    return a;
  }

  THROW("error: predict called in unknown state");
}